

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::ArchiveShellCommand::executeExternalCommand
          (ArchiveShellCommand *this,BuildSystem *param_1,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  code *pcVar1;
  ProcessAttributes attributes;
  StringRef *pSVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ArrayRef<llvm::StringRef> commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Child local_e8;
  Twine *pTStack_e0;
  Twine *local_d8;
  Child CStack_d0;
  ulong local_c8;
  Child local_c0;
  TaskInterface local_b8;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  StringRef *local_88;
  long lStack_80;
  long local_78;
  undefined1 local_70 [24];
  code *local_58;
  bool local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_b8.ctx = ti.ctx;
  local_b8.impl = ti.impl;
  llvm::Twine::Twine((Twine *)&local_e8,&this->archiveName);
  iVar3 = llvm::sys::fs::remove((fs *)&local_e8.character,(char *)0x1);
  if (iVar3 == 0) {
    (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_(&local_48,this);
    local_88 = (StringRef *)0x0;
    lStack_80 = 0;
    local_78 = 0;
    std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_88,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pSVar2 = local_88;
    lVar5 = lStack_80 - (long)local_88;
    local_a8 = 1;
    uStack_a0 = 0;
    uStack_98 = 0;
    uStack_90 = 0x101;
    bVar4 = (completionFn->Storage).hasVal;
    local_c8 = CONCAT71(local_c8._1_7_,bVar4);
    if ((bool)bVar4 == true) {
      local_d8 = (Twine *)0x0;
      CStack_d0.twine = (Twine *)0x0;
      local_e8.twine = (Twine *)0x0;
      pTStack_e0 = (Twine *)0x0;
      pcVar1 = *(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                         0x10);
      if (pcVar1 == (code *)0x0) {
        completionFn = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)0x0;
        local_c0.twine = (Twine *)0x0;
      }
      else {
        (*pcVar1)(&local_e8,completionFn,2);
        CStack_d0 = *(Child *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.
                               buffer + 0x18);
        completionFn = *(Optional<std::function<void_(llbuild::basic::ProcessResult)>_> **)
                        ((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer +
                        0x10);
        bVar4 = (byte)local_c8;
        local_d8 = (Twine *)completionFn;
        local_c0 = CStack_d0;
      }
    }
    local_70._0_8_ = operator_new(0x28);
    ((Child *)(local_70._0_8_ + 0x20))->character = bVar4;
    if ((bVar4 & 1) != 0) {
      *(Twine **)local_70._0_8_ = (Twine *)0x0;
      ((Child *)(local_70._0_8_ + 8))->twine = (Twine *)0x0;
      ((Child *)(local_70._0_8_ + 0x10))->twine = (Twine *)0x0;
      *(Child *)(local_70._0_8_ + 0x18) = local_c0;
      if ((Twine *)completionFn != (Twine *)0x0) {
        *(Child *)local_70._0_8_ = (Twine *)local_e8;
        ((Child *)(local_70._0_8_ + 8))->twine = pTStack_e0;
        ((Child *)(local_70._0_8_ + 0x10))->twine = (Twine *)completionFn;
        local_d8 = (Twine *)0x0;
        CStack_d0.twine = (Twine *)0x0;
      }
    }
    local_50 = true;
    local_58 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
               ::_M_invoke;
    local_70[8] = '\0';
    local_70[9] = '\0';
    local_70[10] = '\0';
    local_70[0xb] = '\0';
    local_70[0xc] = '\0';
    local_70[0xd] = '\0';
    local_70[0xe] = '\0';
    local_70[0xf] = '\0';
    local_70._16_8_ =
         std::
         _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3488:15)>
         ::_M_manager;
    attributes._2_6_ = uStack_a6;
    attributes.canSafelyInterrupt = (bool)(undefined1)local_a8;
    attributes.connectToConsole = (bool)local_a8._1_1_;
    attributes._26_6_ = uStack_8e;
    attributes.inheritEnvironment = (bool)(undefined1)uStack_90;
    attributes.controlEnabled = (bool)uStack_90._1_1_;
    attributes.workingDir.Data = (char *)uStack_a0;
    attributes.workingDir.Length = uStack_98;
    commandLine.Length = lVar5 >> 4;
    commandLine.Data = pSVar2;
    llbuild::core::TaskInterface::spawn
              (&local_b8,context,commandLine,
               (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_70,
               (ProcessDelegate *)0x0);
    if (local_50 == true) {
      if ((code *)local_70._16_8_ != (code *)0x0) {
        (*(code *)local_70._16_8_)(local_70,local_70,3);
      }
      local_50 = false;
    }
    if (((local_c8 & 1) != 0) && (local_d8 != (Twine *)0x0)) {
      (*(code *)local_d8)(&local_e8,&local_e8,3);
    }
    if (local_88 != (StringRef *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  else if ((completionFn->Storage).hasVal == true) {
    local_e8 = (Child)0xffffffff00000001;
    pTStack_e0 = (Twine *)CONCAT44(pTStack_e0._4_4_,0xffffffff);
    local_d8 = (Twine *)0x0;
    CStack_d0 = (Child)0x0;
    local_c8 = 0;
    if (*(long *)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x10)
        == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((completionFn->Storage).storage.super_AlignedCharArray<8UL,_32UL>.buffer + 0x18))
              (completionFn,&local_e8);
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // First delete the current archive
    // TODO instead insert, update and remove files from the archive
    if (llvm::sys::fs::remove(archiveName, /*IgnoreNonExisting*/ true)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Create archive
    auto args = getArgs();
    ti.spawn(context,
             std::vector<StringRef>(args.begin(), args.end()),
             {}, {true},
             {[completionFn](ProcessResult result) {
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }});
  }